

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

TimeProcessingResult __thiscall
helics::TimeCoordinator::processTimeMessage(TimeCoordinator *this,ActionMessage *cmd)

{
  TimeDependencies *this_00;
  GlobalFederateId gid;
  long lVar1;
  _Alloc_hider __src;
  TimeProcessingResult TVar2;
  action_t aVar3;
  DependencyInfo *pDVar4;
  ulong uVar5;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  checkRes;
  ActionMessage resp;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  ActionMessage local_d0;
  
  aVar3 = cmd->messageAction;
  if (aVar3 < cmd_force_time_grant) {
    if (0x2c < (uint)aVar3) goto LAB_003497a5;
    uVar5 = (ulong)(uint)aVar3;
    if ((0x3c8UL >> (uVar5 & 0x3f) & 1) == 0) {
      if ((0x1b0000000000U >> (uVar5 & 0x3f) & 1) != 0) {
        TVar2 = processTimeBlockMessage(this,cmd);
        return TVar2;
      }
      if (uVar5 == 0x26) {
        if (((this->super_BaseTimeCoordinator).disconnected == false) &&
           ((this->lastSend).mTimeState != error)) {
          BaseTimeCoordinator::generateTimeRequest
                    (&local_d0,&this->super_BaseTimeCoordinator,&this->lastSend,
                     (GlobalFederateId)(cmd->source_id).gid,(uint)cmd->counter);
          if ((this->triggered == true) &&
             (local_d0.flags._0_1_ = (byte)local_d0.flags | 2, (cmd->source_id).gid == 1)) {
            this->triggered = false;
          }
          if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager
              == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                    ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_d0);
          TimeDependencies::updateTime(&(this->super_BaseTimeCoordinator).dependencies,cmd);
        }
        else {
          ActionMessage::ActionMessage
                    (&local_d0,cmd_disconnect,
                     (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
                     (GlobalFederateId)(cmd->source_id).gid);
          local_d0.source_handle.hid = (BaseType)cmd->counter;
          if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager
              == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                    ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_d0);
        }
        goto LAB_003499e5;
      }
      goto LAB_003497a5;
    }
  }
  else {
    if (aVar3 == cmd_force_time_grant) {
      lVar1 = (cmd->actionTime).internalTimeCode;
      if (lVar1 <= (this->time_granted).internalTimeCode) {
        return NOT_PROCESSED;
      }
      (this->time_granted).internalTimeCode = lVar1;
      (this->time_grantBase).internalTimeCode = lVar1;
      ActionMessage::ActionMessage(&local_d0,cmd_time_grant);
      local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      local_d0.actionTime.internalTimeCode = (this->time_granted).internalTimeCode;
      (this->lastSend).next.internalTimeCode = local_d0.actionTime.internalTimeCode;
      (this->lastSend).Te.internalTimeCode = local_d0.actionTime.internalTimeCode;
      (this->lastSend).minDe.internalTimeCode = local_d0.actionTime.internalTimeCode;
      (this->lastSend).mTimeState = time_granted;
      transmitTimingMessages(this,&local_d0,(GlobalFederateId)0x8831d580);
LAB_003499e5:
      ActionMessage::~ActionMessage(&local_d0);
      return PROCESSED;
    }
    if ((aVar3 != cmd_local_error) && (aVar3 != cmd_global_error)) goto LAB_003497a5;
  }
  (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[7])
            (this,(ulong)(uint)(cmd->source_id).gid);
  aVar3 = cmd->messageAction;
LAB_003497a5:
  if (((aVar3 == cmd_time_grant) &&
      (gid.gid = (cmd->source_id).gid, gid.gid != (this->super_BaseTimeCoordinator).mSourceId.gid))
     && (pDVar4 = TimeDependencies::getDependencyInfo
                            (&(this->super_BaseTimeCoordinator).dependencies,gid),
        pDVar4 == (DependencyInfo *)0x0)) {
    return NOT_PROCESSED;
  }
  this_00 = &(this->super_BaseTimeCoordinator).dependencies;
  TVar2 = TimeDependencies::updateTime(this_00,cmd);
  if (TVar2 != PROCESSED_AND_CHECK) {
    return TVar2;
  }
  TimeDependencies::checkForIssues_abi_cxx11_
            (&local_f8,this_00,(this->info).wait_for_current_time_updates);
  if (local_f8.first != 0) {
    ActionMessage::ActionMessage(&local_d0,cmd_global_error);
    __src._M_p = local_f8.second._M_dataplus._M_p;
    local_d0.dest_id.gid = 0;
    local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    local_d0.messageID = local_f8.first;
    if ((byte *)local_f8.second._M_dataplus._M_p == local_d0.payload.heap) {
      local_d0.payload.bufferSize = local_f8.second._M_string_length;
    }
    else {
      SmallBuffer::reserve(&local_d0.payload,local_f8.second._M_string_length);
      local_d0.payload.bufferSize = local_f8.second._M_string_length;
      if (local_f8.second._M_string_length != 0) {
        memcpy(local_d0.payload.heap,__src._M_p,local_f8.second._M_string_length);
      }
    }
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
              ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_d0);
    ActionMessage::~ActionMessage(&local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.second._M_dataplus._M_p != &local_f8.second.field_2) {
    operator_delete(local_f8.second._M_dataplus._M_p,
                    local_f8.second.field_2._M_allocated_capacity + 1);
  }
  return PROCESSED;
}

Assistant:

TimeProcessingResult TimeCoordinator::processTimeMessage(const ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_TIME_BLOCK:
        case CMD_TIME_UNBLOCK:
        case CMD_TIME_BARRIER:
        case CMD_TIME_BARRIER_CLEAR:
            return processTimeBlockMessage(cmd);
        case CMD_FORCE_TIME_GRANT:
            if (time_granted < cmd.actionTime) {
                time_granted = cmd.actionTime;
                time_grantBase = time_granted;

                ActionMessage treq(CMD_TIME_GRANT);
                treq.source_id = mSourceId;
                treq.actionTime = time_granted;
                lastSend.next = time_granted;
                lastSend.Te = time_granted;
                lastSend.minDe = time_granted;
                lastSend.mTimeState = TimeState::time_granted;
                transmitTimingMessages(treq);
                return TimeProcessingResult::PROCESSED;
            }
            return TimeProcessingResult::NOT_PROCESSED;
        case CMD_DISCONNECT:
        case CMD_BROADCAST_DISCONNECT:
        case CMD_DISCONNECT_CORE:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_BROKER:
        case CMD_GLOBAL_ERROR:
        case CMD_LOCAL_ERROR:
            // this command requires removing dependents as well as dealing with dependency
            // processing
            removeDependent(cmd.source_id);
            break;
        case CMD_REQUEST_CURRENT_TIME:
            if (disconnected || lastSend.mTimeState == TimeState::error) {
                ActionMessage treq(CMD_DISCONNECT, mSourceId, cmd.source_id);
                treq.setExtraDestData(cmd.counter);
                sendMessageFunction(treq);
            } else {
                auto resp = generateTimeRequest(lastSend, cmd.source_id, cmd.counter);
                if (triggered) {
                    setActionFlag(resp, destination_target);
                    if (cmd.source_id == gRootBrokerID) {
                        triggered = false;
                    }
                }
                sendMessageFunction(resp);
                dependencies.updateTime(cmd);
            }

            return TimeProcessingResult::PROCESSED;
        default:
            break;
    }
    if (isDelayableMessage(cmd, mSourceId)) {
        auto* dep = dependencies.getDependencyInfo(cmd.source_id);
        if (dep == nullptr) {
            return TimeProcessingResult::NOT_PROCESSED;
        }
        switch (dep->mTimeState) {
            case TimeState::time_requested:
                if (dep->next > time_exec) {
                    //     return TimeProcessingResult::delay_processing;
                }
                break;
            case TimeState::time_requested_iterative:
                if (dep->next > time_exec) {
                    //         return TimeProcessingResult::delay_processing;
                }
                if ((iterating != IterationRequest::NO_ITERATIONS) && (time_exec == dep->next)) {
                    //       return TimeProcessingResult::delay_processing;
                }
                break;
            case TimeState::exec_requested_iterative:
                if ((iterating != IterationRequest::NO_ITERATIONS) && (checkingExec) &&
                    (dep->hasData)) {
                    //          return TimeProcessingResult::delay_processing;
                }
                break;
            default:
                break;
        }
    }
    auto procRes = dependencies.updateTime(cmd);
    if (procRes == TimeProcessingResult::PROCESSED_AND_CHECK) {
        auto checkRes = dependencies.checkForIssues(info.wait_for_current_time_updates);
        if (checkRes.first != 0) {
            ActionMessage ge(CMD_GLOBAL_ERROR);
            ge.dest_id = parent_broker_id;
            ge.source_id = mSourceId;
            ge.messageID = checkRes.first;
            ge.payload = checkRes.second;
            sendMessageFunction(ge);
        }
        procRes = TimeProcessingResult::PROCESSED;
    }

    return procRes;
}